

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::analysis::DebugInfoManager::DerefDebugExpression
          (DebugInfoManager *this,Instruction *dbg_expr)

{
  initializer_list<unsigned_int> init_list;
  undefined8 uVar1;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> this_00;
  bool bVar2;
  CommonDebugInfoInstructions CVar3;
  uint32_t res_id;
  IRContext *pIVar4;
  Instruction *pIVar5;
  pointer pIVar6;
  DefUseManager *this_01;
  undefined1 local_a0 [16];
  Instruction *deref_expr_instr;
  spv_opcode_table local_88;
  spv_ext_inst_table local_80;
  SmallVector<unsigned_int,_2UL> local_78;
  Operand local_50;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_20;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  deref_expr;
  Instruction *dbg_expr_local;
  DebugInfoManager *this_local;
  
  deref_expr._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )dbg_expr;
  CVar3 = opt::Instruction::GetCommonDebugOpcode(dbg_expr);
  this_00._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       deref_expr._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (CVar3 != CommonDebugInfoDebugExpression) {
    __assert_fail("dbg_expr->GetCommonDebugOpcode() == CommonDebugInfoDebugExpression",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                  ,0x177,
                  "Instruction *spvtools::opt::analysis::DebugInfoManager::DerefDebugExpression(Instruction *)"
                 );
  }
  pIVar4 = context(this);
  pIVar5 = opt::Instruction::Clone
                     ((Instruction *)
                      this_00._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
                      pIVar4);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_20,pIVar5);
  pIVar6 = std::
           unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ::operator->(&local_20);
  pIVar4 = context(this);
  res_id = IRContext::TakeNextId(pIVar4);
  opt::Instruction::SetResultId(pIVar6,res_id);
  pIVar6 = std::
           unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ::operator->(&local_20);
  pIVar5 = GetDebugOperationWithDeref(this);
  deref_expr_instr._4_4_ = opt::Instruction::result_id(pIVar5);
  local_88 = (spv_opcode_table)((long)&deref_expr_instr + 4);
  local_80 = (spv_ext_inst_table)0x1;
  init_list._M_len = 1;
  init_list._M_array = (iterator)local_88;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_78,init_list);
  Operand::Operand(&local_50,SPV_OPERAND_TYPE_ID,&local_78);
  opt::Instruction::InsertOperand(pIVar6,4,&local_50);
  Operand::~Operand(&local_50);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_78);
  context(this);
  IRContext::ext_inst_debuginfo_end((IRContext *)local_a0);
  pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator->
                     ((iterator_template<spvtools::opt::Instruction> *)local_a0);
  local_a0._8_8_ = opt::Instruction::InsertBefore(pIVar5,&local_20);
  AnalyzeDebugInst(this,(Instruction *)local_a0._8_8_);
  pIVar4 = context(this);
  bVar2 = IRContext::AreAnalysesValid(pIVar4,kAnalysisBegin);
  if (bVar2) {
    pIVar4 = context(this);
    this_01 = IRContext::get_def_use_mgr(pIVar4);
    DefUseManager::AnalyzeInstDefUse(this_01,(Instruction *)local_a0._8_8_);
  }
  uVar1 = local_a0._8_8_;
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_20);
  return (Instruction *)uVar1;
}

Assistant:

Instruction* DebugInfoManager::DerefDebugExpression(Instruction* dbg_expr) {
  assert(dbg_expr->GetCommonDebugOpcode() == CommonDebugInfoDebugExpression);
  std::unique_ptr<Instruction> deref_expr(dbg_expr->Clone(context()));
  deref_expr->SetResultId(context()->TakeNextId());
  deref_expr->InsertOperand(
      kDebugExpressOperandOperationIndex,
      {SPV_OPERAND_TYPE_ID, {GetDebugOperationWithDeref()->result_id()}});
  auto* deref_expr_instr =
      context()->ext_inst_debuginfo_end()->InsertBefore(std::move(deref_expr));
  AnalyzeDebugInst(deref_expr_instr);
  if (context()->AreAnalysesValid(IRContext::Analysis::kAnalysisDefUse))
    context()->get_def_use_mgr()->AnalyzeInstDefUse(deref_expr_instr);
  return deref_expr_instr;
}